

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O1

void __thiscall
VariationalBayesEstimatorOnLDA::writeParameter
          (VariationalBayesEstimatorOnLDA *this,string *thetaFilename,string *phiFilename,
          string *alphaFilename,string *betaFilename)

{
  pointer pcVar1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (thetaFilename->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + thetaFilename->_M_string_length);
  outputVector<double>(&this->_thetaEx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar1 = (phiFilename->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + phiFilename->_M_string_length);
  outputVector<double>(&this->_phiEx,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pcVar1 = (alphaFilename->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + alphaFilename->_M_string_length);
  outputVector<double>(&this->_alphaTimeSeries,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pcVar1 = (betaFilename->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + betaFilename->_M_string_length);
  outputVector<double>(&this->_betaTimeSeries,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::writeParameter(string thetaFilename, string phiFilename, string alphaFilename, string betaFilename)const{//{{{
    outputVector(_thetaEx, thetaFilename);
    outputVector(_phiEx, phiFilename);
    outputVector(_alphaTimeSeries, alphaFilename);
    outputVector(_betaTimeSeries, betaFilename);
}